

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterConversion.h
# Opt level: O0

integer32 PixelToaster::clamped_fraction_8(float input)

{
  float fVar1;
  FloatInteger value;
  float input_local;
  
  fVar1 = (float)clamp_positive((integer32)input);
  if ((int)fVar1 < 0x3f7fffff) {
    value.f = fVar1 + 1.0 & 0x7f8000;
  }
  else {
    value.f = 1.1709026e-38;
  }
  return value.i;
}

Assistant:

inline integer32 clamped_fraction_8(float input)
{
    FloatInteger value;

    value.f = input;
    value.i = clamp_positive(value.i);

    if (value.i >= 0x3F7FFFFF)
        return 0x07F8000;

    value.f += 1.0f;

    return value.i & 0x07F8000;
}